

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

void anon_unknown.dwarf_41c2c8::AddFile(CSHA512 *hasher,char *path)

{
  long lVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  long in_FS_OFFSET;
  undefined4 uStack_10c0;
  int n;
  size_t total;
  char *path_local;
  CSHA512 *hasher_local;
  int f;
  uchar fbuf [4096];
  stat sb;
  
  fbuf[0x98] = '\0';
  fbuf[0x99] = '\0';
  fbuf[0x9a] = '\0';
  fbuf[0x9b] = '\0';
  fbuf[0x9c] = '\0';
  fbuf[0x9d] = '\0';
  fbuf[0x9e] = '\0';
  fbuf[0x9f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&sb,0,0x90);
  __fd = open(path,0);
  total = 0;
  if (__fd != -1) {
    CSHA512::Write(hasher,(uchar *)path,0);
    iVar2 = fstat(__fd,(stat *)&sb);
    if (iVar2 == 0) {
      (anonymous_namespace)::operator<<((CSHA512 *)0x0,(stat *)CONCAT44(n,uStack_10c0));
    }
    do {
      sVar3 = read(__fd,fbuf,0x1000);
      iVar2 = (int)sVar3;
      if (0 < iVar2) {
        CSHA512::Write(hasher,(uchar *)path,total);
      }
      total = (long)iVar2 + total;
      uStack_10c0._3_1_ = iVar2 == 0x1000 && total < 0x100000;
    } while (uStack_10c0._3_1_);
    close(__fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddFile(CSHA512& hasher, const char *path)
{
    struct stat sb = {};
    int f = open(path, O_RDONLY);
    size_t total = 0;
    if (f != -1) {
        unsigned char fbuf[4096];
        int n;
        hasher.Write((const unsigned char*)&f, sizeof(f));
        if (fstat(f, &sb) == 0) hasher << sb;
        do {
            n = read(f, fbuf, sizeof(fbuf));
            if (n > 0) hasher.Write(fbuf, n);
            total += n;
            /* not bothering with EINTR handling. */
        } while (n == sizeof(fbuf) && total < 1048576); // Read only the first 1 Mbyte
        close(f);
    }
}